

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCSM.cpp
# Opt level: O3

NaPNEvent __thiscall NaControlSystemModel::run_net(NaControlSystemModel *this)

{
  char cVar1;
  uint uVar2;
  NaPNEvent NVar3;
  int iVar4;
  long *plVar5;
  bool bVar6;
  NaPNEvent NVar7;
  NaPNEvent unaff_R13D;
  NaVector rAux;
  NaVector rMain;
  NaVector local_60 [24];
  NaVector local_48 [24];
  
  plVar5 = (long *)NaPetriCnInput::data();
  uVar2 = (**(code **)(*plVar5 + 0x30))(plVar5);
  NaVector::NaVector(local_48,uVar2);
  plVar5 = (long *)NaPetriCnInput::data();
  uVar2 = (**(code **)(*plVar5 + 0x30))(plVar5);
  NaVector::NaVector(local_60,uVar2);
  NaVector::init_value(1.0);
  NaVector::init_value(-1.0);
  NaPetriCnOutput::set_starter((NaVector *)&this->field_0x4a0);
  NaPNSum::set_gain((NaVector *)&this->onsum,local_48);
  NaPetriNet::set_timing_node((NaPetriNode *)&this->net);
  bVar6 = SUB81(&this->net,0);
  cVar1 = NaPetriNet::prepare(bVar6);
  if (cVar1 == '\0') {
    NaPrintLog("IMPORTANT: verification failed!\n");
  }
  else {
    do {
      NVar3 = NaPetriNet::step_alive(bVar6);
      (*this->_vptr_NaControlSystemModel[5])(this);
      NVar7 = NVar3;
      if (this->nSeriesLen != 0) {
        uVar2 = NaPetriNode::activations();
        NVar7 = pneDead;
        if (uVar2 <= (uint)this->nSeriesLen) {
          NVar7 = NVar3;
        }
      }
      iVar4 = (*this->_vptr_NaControlSystemModel[4])(this);
      unaff_R13D = pneTerminate;
      if ((char)iVar4 == '\0') {
        unaff_R13D = NVar7;
      }
    } while (unaff_R13D == pneAlive);
    NaPetriNet::terminate(bVar6);
  }
  NaVector::~NaVector(local_60);
  NaVector::~NaVector(local_48);
  if (cVar1 == '\0') {
    unaff_R13D = pneError;
  }
  return unaff_R13D;
}

Assistant:

NaPNEvent
NaControlSystemModel::run_net ()
{
    try{
	NaVector	rMain(onsum.main.data().dim());
	NaVector	rAux(onsum.aux.data().dim());
	rMain.init_value(1.);
	rAux.init_value(-1.);

	cmp.cmp.set_starter(vInitial);
	onsum.set_gain(rMain, rAux);

	net.set_timing_node((NaPetriNode*)&cmp);

        // Prepare petri net engine
        if(!net.prepare()){
            NaPrintLog("IMPORTANT: verification failed!\n");
        }
        else{
            NaPNEvent       pnev;

#if defined(__MSDOS__) || defined(__WIN32__)
            printf("Press 'q' or 'x' for exit\n");
#endif /* DOS & Win */

            // Activities cycle
            do{
                pnev = net.step_alive();

                idle_entry();

		if(0 != nSeriesLen && setpnt_gen.activations() > nSeriesLen)
		    pnev = pneDead;

                if(user_break())
                    pnev = pneTerminate;

            }while(pneAlive == pnev);

            net.terminate();

            return pnev;
        }
    }
    catch(NaException& ex){
        NaPrintLog("EXCEPTION at runtime phase: %s\n", NaExceptionMsg(ex));
    }
    return pneError;
}